

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

ssize_t __thiscall LASinterval::read(LASinterval *this,int __fd,void *__buf,size_t __nbytes)

{
  unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
  *this_00;
  int iVar1;
  ulong extraout_RAX;
  ulong uVar2;
  LASintervalStartCell *this_01;
  LASintervalCell *this_02;
  undefined4 in_register_00000034;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>,_bool>
  pVar3;
  U32 local_78;
  int local_74;
  U32 number_points;
  U32 number_intervals;
  LASintervalCell *cell;
  undefined1 local_60;
  pair<const_int,_LASintervalStartCell_*> local_58;
  LASintervalStartCell *local_48;
  LASintervalStartCell *start_cell;
  I32 cell_index;
  U32 number_cells;
  U32 version;
  char local_24 [4];
  long *plStack_20;
  char signature [4];
  ByteStreamIn *stream_local;
  LASinterval *this_local;
  
  plStack_20 = (long *)CONCAT44(in_register_00000034,__fd);
  (**(code **)(*plStack_20 + 8))(plStack_20,local_24,4);
  iVar1 = strncmp(local_24,"LASV",4);
  if (iVar1 == 0) {
    (**(code **)(*plStack_20 + 0x18))(plStack_20,&cell_index);
    uVar2 = (**(code **)(*plStack_20 + 0x18))(plStack_20,(long)&start_cell + 4);
    while (start_cell._4_4_ != 0) {
      (**(code **)(*plStack_20 + 0x18))(plStack_20,&start_cell);
      this_01 = (LASintervalStartCell *)operator_new(0x20);
      LASintervalStartCell::LASintervalStartCell(this_01);
      this_00 = (unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
                 *)this->cells;
      local_48 = this_01;
      std::pair<const_int,_LASintervalStartCell_*>::pair<int_&,_LASintervalStartCell_*&,_true>
                (&local_58,(int *)&start_cell,&local_48);
      pVar3 = std::
              unordered_map<int,_LASintervalStartCell_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>_>
              ::insert(this_00,&local_58);
      cell = (LASintervalCell *)
             pVar3.first.
             super__Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false>._M_cur;
      local_60 = pVar3.second;
      _number_points = local_48;
      (**(code **)(*plStack_20 + 0x18))(plStack_20,&local_74);
      (**(code **)(*plStack_20 + 0x18))(plStack_20,&local_78);
      local_48->full = local_78;
      local_48->total = 0;
      while (local_74 != 0) {
        (**(code **)(*plStack_20 + 0x18))(plStack_20,_number_points);
        (**(code **)(*plStack_20 + 0x18))(plStack_20,&(_number_points->super_LASintervalCell).end);
        local_48->total =
             ((_number_points->super_LASintervalCell).end -
             (_number_points->super_LASintervalCell).start) + 1 + local_48->total;
        local_74 = local_74 + -1;
        if (local_74 != 0) {
          this_02 = (LASintervalCell *)operator_new(0x10);
          LASintervalCell::LASintervalCell(this_02);
          (_number_points->super_LASintervalCell).next = this_02;
          _number_points = (LASintervalStartCell *)(_number_points->super_LASintervalCell).next;
        }
      }
      start_cell._4_4_ = start_cell._4_4_ - 1;
      uVar2 = (ulong)start_cell._4_4_;
    }
    this_local._7_1_ = 1;
  }
  else {
    laserror<char*>("(LASinterval): wrong signature %4s instead of \'LASV\'",local_24);
    this_local._7_1_ = 0;
    uVar2 = extraout_RAX;
  }
  return CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

BOOL LASinterval::read(ByteStreamIn* stream)
{
  char signature[4];
  try { stream->getBytes((U8*)signature, 4); } catch (...)
  {
    laserror("(LASinterval): reading signature");
    return FALSE;
  }
  if (strncmp(signature, "LASV", 4) != 0)
  {
    laserror("(LASinterval): wrong signature %4s instead of 'LASV'", signature);
    return FALSE;
  }
  U32 version;
  try { stream->get32bitsLE((U8*)&version); } catch (...)
  {
    laserror("(LASinterval): reading version");
    return FALSE;
  }
  // read number of cells
  U32 number_cells;
  try { stream->get32bitsLE((U8*)&number_cells); } catch (...)
  {
    laserror("(LASinterval): reading number of cells");
    return FALSE;
  }
  // loop over all cells
  while (number_cells)
  {
    // read index of cell
    I32 cell_index;
    try { stream->get32bitsLE((U8*)&cell_index); } catch (...)
    {
      laserror("(LASinterval): reading cell index");
      return FALSE;
    }
    // create cell and insert into hash
    LASintervalStartCell* start_cell = new LASintervalStartCell();
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(cell_index, start_cell));
    LASintervalCell* cell = start_cell;
    // read number of intervals in cell
    U32 number_intervals;
    try { stream->get32bitsLE((U8*)&number_intervals); } catch (...)
    {
      laserror("(LASinterval): reading number of intervals in cell");
      return FALSE;
    }
    // read number of points in cell
    U32 number_points;
    try { stream->get32bitsLE((U8*)&number_points); } catch (...)
    {
      laserror("(LASinterval): reading number of points in cell");
      return FALSE;
    }
    start_cell->full = number_points;
    start_cell->total = 0;
    while (number_intervals)
    {
      // read start of interval
      try { stream->get32bitsLE((U8*)&(cell->start)); } catch (...)
      {
        laserror("(LASinterval): reading start %d of interval", cell->start);
        return FALSE;
      }
      // read end of interval
      try { stream->get32bitsLE((U8*)&(cell->end)); } catch (...)
      {
        laserror("(LASinterval): reading end %d of interval", cell->end);
        return FALSE;
      }
      start_cell->total += (cell->end - cell->start + 1);
      number_intervals--;
      if (number_intervals)
      {
        cell->next = new LASintervalCell();
        cell = cell->next;
      }
    }
    number_cells--;
  }

  return TRUE;
}